

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O1

CURLcode Curl_ssl_easy_config_complete(Curl_easy *data)

{
  char *pcVar1;
  
  pcVar1 = (data->set).str[6];
  (data->set).ssl.primary.CApath = (data->set).str[5];
  (data->set).ssl.primary.CAfile = pcVar1;
  (data->set).ssl.primary.CRLfile = (data->set).str[10];
  (data->set).ssl.primary.issuercert = (data->set).str[0xb];
  (data->set).ssl.primary.issuercert_blob = (data->set).blobs[2];
  pcVar1 = (data->set).str[9];
  (data->set).ssl.primary.cipher_list = (data->set).str[8];
  (data->set).ssl.primary.cipher_list13 = pcVar1;
  (data->set).ssl.primary.pinned_key = (data->set).str[7];
  (data->set).ssl.primary.cert_blob = (data->set).blobs[0];
  (data->set).ssl.primary.ca_info_blob = (data->set).blobs[3];
  (data->set).ssl.primary.curves = (data->set).str[0x43];
  pcVar1 = (data->set).str[0x39];
  (data->set).ssl.primary.username = (data->set).str[0x38];
  (data->set).ssl.primary.password = pcVar1;
  pcVar1 = (data->set).str[2];
  (data->set).ssl.cert_type = (data->set).str[1];
  (data->set).ssl.key = pcVar1;
  (data->set).ssl.key_type = (data->set).str[4];
  (data->set).ssl.key_passwd = (data->set).str[3];
  (data->set).ssl.primary.clientcert = (data->set).str[0];
  (data->set).ssl.key_blob = (data->set).blobs[1];
  pcVar1 = (data->set).str[0x13];
  (data->set).proxy_ssl.primary.CApath = (data->set).str[0x12];
  (data->set).proxy_ssl.primary.CAfile = pcVar1;
  (data->set).proxy_ssl.primary.cipher_list = (data->set).str[0x15];
  (data->set).proxy_ssl.primary.cipher_list13 = (data->set).str[0x16];
  (data->set).proxy_ssl.primary.pinned_key = (data->set).str[0x14];
  (data->set).proxy_ssl.primary.cert_blob = (data->set).blobs[4];
  (data->set).proxy_ssl.primary.ca_info_blob = (data->set).blobs[7];
  (data->set).proxy_ssl.primary.issuercert = (data->set).str[0x18];
  (data->set).proxy_ssl.primary.issuercert_blob = (data->set).blobs[6];
  (data->set).proxy_ssl.primary.CRLfile = (data->set).str[0x17];
  (data->set).proxy_ssl.cert_type = (data->set).str[0xe];
  (data->set).proxy_ssl.key = (data->set).str[0xf];
  (data->set).proxy_ssl.key_type = (data->set).str[0x11];
  (data->set).proxy_ssl.key_passwd = (data->set).str[0x10];
  (data->set).proxy_ssl.primary.clientcert = (data->set).str[0xd];
  (data->set).proxy_ssl.key_blob = (data->set).blobs[5];
  (data->set).proxy_ssl.primary.username = (data->set).str[0x3a];
  (data->set).proxy_ssl.primary.password = (data->set).str[0x3b];
  return CURLE_OK;
}

Assistant:

CURLcode Curl_ssl_easy_config_complete(struct Curl_easy *data)
{
  data->set.ssl.primary.CApath = data->set.str[STRING_SSL_CAPATH];
  data->set.ssl.primary.CAfile = data->set.str[STRING_SSL_CAFILE];
  data->set.ssl.primary.CRLfile = data->set.str[STRING_SSL_CRLFILE];
  data->set.ssl.primary.issuercert = data->set.str[STRING_SSL_ISSUERCERT];
  data->set.ssl.primary.issuercert_blob = data->set.blobs[BLOB_SSL_ISSUERCERT];
  data->set.ssl.primary.cipher_list =
    data->set.str[STRING_SSL_CIPHER_LIST];
  data->set.ssl.primary.cipher_list13 =
    data->set.str[STRING_SSL_CIPHER13_LIST];
  data->set.ssl.primary.pinned_key =
    data->set.str[STRING_SSL_PINNEDPUBLICKEY];
  data->set.ssl.primary.cert_blob = data->set.blobs[BLOB_CERT];
  data->set.ssl.primary.ca_info_blob = data->set.blobs[BLOB_CAINFO];
  data->set.ssl.primary.curves = data->set.str[STRING_SSL_EC_CURVES];
#ifdef USE_TLS_SRP
  data->set.ssl.primary.username = data->set.str[STRING_TLSAUTH_USERNAME];
  data->set.ssl.primary.password = data->set.str[STRING_TLSAUTH_PASSWORD];
#endif
  data->set.ssl.cert_type = data->set.str[STRING_CERT_TYPE];
  data->set.ssl.key = data->set.str[STRING_KEY];
  data->set.ssl.key_type = data->set.str[STRING_KEY_TYPE];
  data->set.ssl.key_passwd = data->set.str[STRING_KEY_PASSWD];
  data->set.ssl.primary.clientcert = data->set.str[STRING_CERT];
  data->set.ssl.key_blob = data->set.blobs[BLOB_KEY];

#ifndef CURL_DISABLE_PROXY
  data->set.proxy_ssl.primary.CApath = data->set.str[STRING_SSL_CAPATH_PROXY];
  data->set.proxy_ssl.primary.CAfile = data->set.str[STRING_SSL_CAFILE_PROXY];
  data->set.proxy_ssl.primary.cipher_list =
    data->set.str[STRING_SSL_CIPHER_LIST_PROXY];
  data->set.proxy_ssl.primary.cipher_list13 =
    data->set.str[STRING_SSL_CIPHER13_LIST_PROXY];
  data->set.proxy_ssl.primary.pinned_key =
    data->set.str[STRING_SSL_PINNEDPUBLICKEY_PROXY];
  data->set.proxy_ssl.primary.cert_blob = data->set.blobs[BLOB_CERT_PROXY];
  data->set.proxy_ssl.primary.ca_info_blob =
    data->set.blobs[BLOB_CAINFO_PROXY];
  data->set.proxy_ssl.primary.issuercert =
    data->set.str[STRING_SSL_ISSUERCERT_PROXY];
  data->set.proxy_ssl.primary.issuercert_blob =
    data->set.blobs[BLOB_SSL_ISSUERCERT_PROXY];
  data->set.proxy_ssl.primary.CRLfile =
    data->set.str[STRING_SSL_CRLFILE_PROXY];
  data->set.proxy_ssl.cert_type = data->set.str[STRING_CERT_TYPE_PROXY];
  data->set.proxy_ssl.key = data->set.str[STRING_KEY_PROXY];
  data->set.proxy_ssl.key_type = data->set.str[STRING_KEY_TYPE_PROXY];
  data->set.proxy_ssl.key_passwd = data->set.str[STRING_KEY_PASSWD_PROXY];
  data->set.proxy_ssl.primary.clientcert = data->set.str[STRING_CERT_PROXY];
  data->set.proxy_ssl.key_blob = data->set.blobs[BLOB_KEY_PROXY];
#ifdef USE_TLS_SRP
  data->set.proxy_ssl.primary.username =
    data->set.str[STRING_TLSAUTH_USERNAME_PROXY];
  data->set.proxy_ssl.primary.password =
    data->set.str[STRING_TLSAUTH_PASSWORD_PROXY];
#endif
#endif /* CURL_DISABLE_PROXY */

  return CURLE_OK;
}